

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

type * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
as<(anonymous_namespace)::ns::Project<std::vector<(anonymous_namespace)::ns::Value,std::allocator<(anonymous_namespace)::ns::Value>>>>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  type *in_RDI;
  Project<std::vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
  *val;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000198;
  
  json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_(anonymous_namespace)::ns::Project<std::vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>_>,_void>
  ::as(in_stack_00000198);
  return in_RDI;
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }